

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

vrna_exp_param_t * scale_pf_parameters(void)

{
  vrna_exp_param_t *pvVar1;
  vrna_exp_param_t *pf;
  vrna_md_t md;
  
  set_model_details((vrna_md_t *)&pf);
  pvVar1 = vrna_exp_params((vrna_md_t *)&pf);
  pvVar1->pf_scale = pf_scale;
  return pvVar1;
}

Assistant:

PUBLIC vrna_exp_param_t *
scale_pf_parameters(void)
{
  vrna_md_t         md;
  vrna_exp_param_t  *pf;

  set_model_details(&md);

  pf            = vrna_exp_params(&md);
  pf->pf_scale  = pf_scale;

  return pf;
}